

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O3

REF_STATUS
ref_dist_bounding_sphere2
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *center,REF_DBL *radius)

{
  REF_DBL *pRVar1;
  long lVar2;
  long lVar3;
  
  pRVar1 = ref_node->real;
  lVar2 = (long)(node0 * 0xf);
  lVar3 = 0;
  do {
    center[lVar3] = (pRVar1[lVar2 + lVar3] + pRVar1[node1 * 0xf + lVar3]) * 0.5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *radius = SQRT((pRVar1[lVar2 + 2] - center[2]) * (pRVar1[lVar2 + 2] - center[2]) +
                 (pRVar1[lVar2 + 1] - center[1]) * (pRVar1[lVar2 + 1] - center[1]) +
                 (pRVar1[lVar2] - *center) * (pRVar1[lVar2] - *center));
  return (REF_STATUS)pRVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_dist_bounding_sphere2(REF_NODE ref_node,
                                                    REF_INT node0,
                                                    REF_INT node1,
                                                    REF_DBL *center,
                                                    REF_DBL *radius) {
  REF_INT i;
  for (i = 0; i < 3; i++)
    center[i] = 0.5 * (ref_node_xyz(ref_node, i, node0) +
                       ref_node_xyz(ref_node, i, node1));
  *radius = sqrt(pow(ref_node_xyz(ref_node, 0, node0) - center[0], 2) +
                 pow(ref_node_xyz(ref_node, 1, node0) - center[1], 2) +
                 pow(ref_node_xyz(ref_node, 2, node0) - center[2], 2));
  return REF_SUCCESS;
}